

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_tri_norm_deviation(REF_GRID ref_grid,REF_INT *nodes,REF_DBL *dot_product)

{
  REF_INT faceid;
  uint uVar1;
  REF_STATUS RVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  REF_DBL area_sign;
  REF_DBL tri_normal [3];
  REF_DBL n [3];
  REF_DBL uv [2];
  REF_DBL s [3];
  REF_DBL r [3];
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_98;
  double local_90;
  double local_88;
  REF_DBL local_78 [2];
  REF_DBL local_68 [4];
  REF_DBL local_48 [3];
  
  *dot_product = -2.0;
  if (ref_grid->geom->meshlink == (void *)0x0) {
    faceid = nodes[ref_grid->cell[3]->node_per];
    uVar1 = ref_node_tri_normal(ref_grid->node,nodes,&local_b8);
    if (uVar1 == 0) {
      uVar1 = ref_math_normalize(&local_b8);
      if (uVar1 != 0) {
        if (uVar1 != 4) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x6e3,"ref_geom_tri_norm_deviation",(ulong)uVar1,"normalize");
          return uVar1;
        }
        return 0;
      }
      uVar1 = ref_geom_tri_centroid(ref_grid,nodes,local_78);
      if (uVar1 == 0) {
        RVar2 = ref_geom_face_rsn(ref_grid->geom,faceid,local_78,local_48,local_68,&local_98);
        if (RVar2 != 0) {
          return RVar2;
        }
        uVar1 = ref_geom_uv_area_sign(ref_grid,faceid,&local_c0);
        if (uVar1 == 0) {
          *dot_product = (local_88 * local_a8 + local_98 * local_b8 + local_90 * local_b0) *
                         local_c0;
          return 0;
        }
        uVar4 = (ulong)uVar1;
        pcVar5 = "a sign";
        uVar3 = 0x6e7;
      }
      else {
        uVar4 = (ulong)uVar1;
        pcVar5 = "tri cent";
        uVar3 = 0x6e5;
      }
    }
    else {
      uVar4 = (ulong)uVar1;
      pcVar5 = "tri normal";
      uVar3 = 0x6df;
    }
  }
  else {
    uVar1 = ref_meshlink_tri_norm_deviation(ref_grid,nodes,dot_product);
    if (uVar1 == 0) {
      return 0;
    }
    uVar4 = (ulong)uVar1;
    pcVar5 = "meshlink";
    uVar3 = 0x6d9;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
         "ref_geom_tri_norm_deviation",uVar4,pcVar5);
  return (REF_STATUS)uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_geom_tri_norm_deviation(REF_GRID ref_grid,
                                               REF_INT *nodes,
                                               REF_DBL *dot_product) {
  REF_DBL uv[2];
  REF_DBL tri_normal[3];
  REF_DBL r[3], s[3], n[3], area_sign;
  REF_INT id;
  REF_STATUS status;
  *dot_product = -2.0;

  if (ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
    RSS(ref_meshlink_tri_norm_deviation(ref_grid, nodes, dot_product),
        "meshlink");
    return REF_SUCCESS;
  }

  id = nodes[ref_cell_node_per(ref_grid_tri(ref_grid))];
  RSS(ref_node_tri_normal(ref_grid_node(ref_grid), nodes, tri_normal),
      "tri normal");
  /* collapse attempts could create zero area, reject the step with -2.0 */
  status = ref_math_normalize(tri_normal);
  if (REF_DIV_ZERO == status) return REF_SUCCESS;
  RSS(status, "normalize");

  RSS(ref_geom_tri_centroid(ref_grid, nodes, uv), "tri cent");
  RAISE(ref_geom_face_rsn(ref_grid_geom(ref_grid), id, uv, r, s, n));
  RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");

  *dot_product = area_sign * ref_math_dot(n, tri_normal);

  return REF_SUCCESS;
}